

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makeTiled.cpp
# Opt level: O1

void makeTiled(char *inFileName,char *outFileName,int partnum,LevelMode mode,
              LevelRoundingMode roundingMode,Compression compression,int tileSizeX,int tileSizeY,
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *doNotFilter,Extrapolation extX,Extrapolation extY,bool verbose)

{
  _Base_ptr p_Var1;
  string *name;
  _Base_ptr p_Var2;
  size_type __n;
  pointer pHVar3;
  pointer pHVar4;
  char *pcVar5;
  char cVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  size_t sVar12;
  Header *pHVar13;
  Box2i *dataWindow;
  _Rb_tree_node_base *p_Var14;
  _Rb_tree_node_base *p_Var15;
  ImageChannel *pIVar16;
  long lVar17;
  Compression *pCVar18;
  long *plVar19;
  ChannelList *pCVar20;
  ostream *poVar21;
  Image *pIVar22;
  char *pcVar23;
  InputExc *this;
  NoImplExc *this_00;
  bool odd;
  ulong *puVar24;
  int y;
  Image *this_01;
  int x;
  Image *image0_00;
  undefined8 uVar25;
  int iVar26;
  int l;
  LevelMode lx;
  undefined1 auVar27 [12];
  InputPart in;
  Header h;
  DeepTiledInputPart in_1;
  MultiPartInputFile input;
  MultiPartOutputFile output;
  vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> headers;
  Header header;
  Image image0;
  FrameBuffer fb;
  Image image1;
  Image image2;
  string local_250;
  undefined1 local_230 [24];
  undefined1 local_218 [24];
  long lStack_200;
  string local_1e0;
  MultiPartInputFile local_1c0 [16];
  char *local_1b0;
  char *local_1a8;
  string local_1a0;
  Compression local_17c;
  vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_> local_178;
  char *local_160;
  TileDescription local_158 [3];
  Image local_120;
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
  local_e0;
  Image local_b0;
  Image local_70;
  
  local_1b0 = (char *)CONCAT44(local_1b0._4_4_,roundingMode);
  local_230._12_4_ = partnum;
  local_17c = compression;
  local_160 = outFileName;
  Image::Image(&local_120);
  Image::Image(&local_b0);
  Image::Image(&local_70);
  local_218._0_8_ = (_Base_ptr)0x0;
  Imf_3_2::Header::Header
            ((Header *)local_158,0x40,0x40,1.0,(Vec2 *)(local_230 + 0x18),1.0,INCREASING_Y,
             ZIP_COMPRESSION);
  local_e0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_e0._M_impl.super__Rb_tree_header._M_header;
  local_e0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_e0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_178.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
  super__Vector_impl_data._M_start = (Header *)0x0;
  local_178.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_e0._M_impl.super__Rb_tree_header._M_header._M_left;
  iVar7 = Imf_3_2::globalThreadCount();
  Imf_3_2::MultiPartInputFile::MultiPartInputFile(local_1c0,inFileName,iVar7,true);
  local_1a8 = inFileName;
  uVar8 = Imf_3_2::MultiPartInputFile::parts();
  if (0 < (int)uVar8) {
    p_Var2 = (_Base_ptr)(local_218 + 0x10);
    local_230._16_8_ = (Image *)0x0;
    name = (string *)(local_230 + 0x18);
    do {
      if (verbose) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"reading file ",0xd);
        pcVar23 = local_1a8;
        if (local_1a8 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x110278);
        }
        else {
          sVar12 = strlen(local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar23,sVar12);
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
        std::ostream::put('x');
        std::ostream::flush();
      }
      if ((uint)local_230._16_8_ == local_230._12_4_) {
        Imf_3_2::InputPart::InputPart((InputPart *)local_230,local_1c0,(uint)local_230._16_8_);
        pHVar13 = (Header *)Imf_3_2::InputPart::header();
        Imf_3_2::Header::operator=((Header *)local_158,pHVar13);
        cVar6 = Imf_3_2::hasEnvmap((Header *)local_158);
        if (cVar6 == '\x01' && mode != ONE_LEVEL) {
          this_00 = (NoImplExc *)__cxa_allocate_exception(0x48);
          Iex_3_2::NoImplExc::NoImplExc
                    (this_00,
                     "This program cannot generate multiresolution environment maps.  Use exrenvmap instead."
                    );
          __cxa_throw(this_00,&Iex_3_2::NoImplExc::typeinfo,Iex_3_2::NoImplExc::~NoImplExc);
        }
        dataWindow = (Box2i *)Imf_3_2::Header::dataWindow();
        Image::resize(&local_120,dataWindow);
        Imf_3_2::Header::channels();
        p_Var14 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::begin();
        while( true ) {
          Imf_3_2::Header::channels();
          p_Var15 = (_Rb_tree_node_base *)Imf_3_2::ChannelList::end();
          if (p_Var14 == p_Var15) break;
          if ((*(int *)&p_Var14[9].field_0x4 != 1) || (*(int *)&p_Var14[9]._M_parent != 1)) {
            this = (InputExc *)__cxa_allocate_exception(0x48);
            Iex_3_2::InputExc::InputExc
                      (this,"Sub-sampled image channels are not supported in tiled files.");
            __cxa_throw(this,&Iex_3_2::InputExc::typeinfo,Iex_3_2::InputExc::~InputExc);
          }
          p_Var15 = p_Var14 + 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)name,(char *)p_Var15,(allocator<char> *)&local_250);
          Image::addChannel(&local_120,name,p_Var14[9]._M_color);
          if ((_Base_ptr)local_218._0_8_ != p_Var2) {
            operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)name,(char *)p_Var15,(allocator<char> *)&local_250);
          Image::addChannel(&local_b0,name,p_Var14[9]._M_color);
          if ((_Base_ptr)local_218._0_8_ != p_Var2) {
            operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)name,(char *)p_Var15,(allocator<char> *)&local_250);
          Image::addChannel(&local_70,name,p_Var14[9]._M_color);
          if ((_Base_ptr)local_218._0_8_ != p_Var2) {
            operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_250,(char *)p_Var15,(allocator<char> *)&local_1a0);
          pIVar16 = Image::channel(&local_120,&local_250);
          (*pIVar16->_vptr_ImageChannel[2])(name,pIVar16);
          Imf_3_2::FrameBuffer::insert((char *)&local_e0,(Slice *)p_Var15);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
          }
          p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14);
        }
        Imf_3_2::InputPart::setFrameBuffer((FrameBuffer *)local_230);
        lVar17 = Imf_3_2::Header::dataWindow();
        iVar7 = *(int *)(lVar17 + 4);
        Imf_3_2::Header::dataWindow();
        Imf_3_2::InputPart::readPixels((int)local_230,iVar7);
        local_218._4_4_ = tileSizeY;
        local_218._0_4_ = tileSizeX;
        local_218._12_4_ = local_1b0._0_4_;
        local_218._8_4_ = mode;
        Imf_3_2::Header::setTileDescription(local_158);
        pCVar18 = (Compression *)Imf_3_2::Header::compression();
        *pCVar18 = local_17c;
        auVar27 = Imf_3_2::Header::lineOrder();
        *auVar27._0_8_ = 0;
        if (mode != ONE_LEVEL) {
          (anonymous_namespace)::extToString_abi_cxx11_
                    (&local_1a0,(_anonymous_namespace_ *)(ulong)extX,auVar27._8_4_);
          plVar19 = (long *)std::__cxx11::string::append((char *)&local_1a0);
          local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
          puVar24 = (ulong *)(plVar19 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar19 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar24) {
            local_250.field_2._M_allocated_capacity = *puVar24;
            local_250.field_2._8_8_ = plVar19[3];
          }
          else {
            local_250.field_2._M_allocated_capacity = *puVar24;
            local_250._M_dataplus._M_p = (pointer)*plVar19;
          }
          local_250._M_string_length = plVar19[1];
          *plVar19 = (long)puVar24;
          plVar19[1] = 0;
          *(undefined1 *)(plVar19 + 2) = 0;
          (anonymous_namespace)::extToString_abi_cxx11_
                    (&local_1e0,(_anonymous_namespace_ *)(ulong)extY,
                     (Extrapolation)local_250._M_string_length);
          uVar25 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            uVar25 = local_250.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar25 < local_1e0._M_string_length + local_250._M_string_length) {
            uVar25 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
              uVar25 = local_1e0.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar25 < local_1e0._M_string_length + local_250._M_string_length)
            goto LAB_00106f33;
            plVar19 = (long *)std::__cxx11::string::replace
                                        ((ulong)&local_1e0,0,(char *)0x0,
                                         (ulong)local_250._M_dataplus._M_p);
          }
          else {
LAB_00106f33:
            plVar19 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&local_250,(ulong)local_1e0._M_dataplus._M_p);
          }
          p_Var1 = (_Base_ptr)(plVar19 + 2);
          if ((_Base_ptr)*plVar19 == p_Var1) {
            local_218._16_8_ = *(undefined8 *)p_Var1;
            lStack_200 = plVar19[3];
            local_218._0_8_ = p_Var2;
          }
          else {
            local_218._16_8_ = *(undefined8 *)p_Var1;
            local_218._0_8_ = (_Base_ptr)*plVar19;
          }
          local_218._8_8_ = plVar19[1];
          *plVar19 = (long)p_Var1;
          plVar19[1] = 0;
          *(undefined1 *)&p_Var1->_M_color = _S_red;
          Imf_3_2::addWrapmodes((Header *)local_158,(string *)name);
          if ((_Base_ptr)local_218._0_8_ != p_Var2) {
            operator_delete((void *)local_218._0_8_,local_218._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
            operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
            operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
          }
        }
        Imf_3_2::Header::setType((string *)local_158);
        Imf_3_2::getChunkOffsetTableSize((Header *)local_158);
        Imf_3_2::Header::setChunkCount((int)local_158);
        std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::push_back
                  (&local_178,(value_type *)local_158);
      }
      else {
        pHVar13 = (Header *)Imf_3_2::MultiPartInputFile::header((int)local_1c0);
        Imf_3_2::Header::Header((Header *)name,pHVar13);
        std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::push_back
                  (&local_178,(value_type *)name);
        Imf_3_2::Header::~Header((Header *)name);
      }
      uVar9 = (int)local_230._16_8_ + 1;
      local_230._16_8_ = ZEXT48(uVar9);
    } while (uVar9 != uVar8);
  }
  pHVar4 = local_178.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pHVar3 = local_178.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar7 = Imf_3_2::globalThreadCount();
  Imf_3_2::MultiPartOutputFile::MultiPartOutputFile
            ((MultiPartOutputFile *)&local_1a0,local_160,pHVar3,
             (int)((ulong)((long)pHVar4 - (long)pHVar3) >> 3) * -0x49249249,false,iVar7);
  if (0 < (int)uVar8) {
    local_1a8 = (char *)(ulong)(uint)local_230._12_4_;
    local_1b0 = (char *)(ulong)uVar8;
    pcVar23 = (char *)0x0;
    do {
      if (pcVar23 == local_1a8) {
        Imf_3_2::TiledOutputPart::TiledOutputPart
                  ((TiledOutputPart *)&local_250,(MultiPartOutputFile *)&local_1a0,local_230._12_4_)
        ;
        Imf_3_2::TiledOutputPart::setFrameBuffer((FrameBuffer *)&local_250);
        if (verbose) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"writing file ",0xd);
          pcVar5 = local_160;
          if (local_160 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x110278);
          }
          else {
            sVar12 = strlen(local_160);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,sVar12);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"\nlevel (0, 0)",0xd);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
          std::ostream::put('x');
          std::ostream::flush();
        }
        iVar7 = 0;
        while( true ) {
          iVar26 = (int)&local_250;
          iVar10 = Imf_3_2::TiledOutputPart::numYTiles(iVar26);
          if (iVar10 <= iVar7) break;
          for (iVar10 = 0; iVar11 = Imf_3_2::TiledOutputPart::numXTiles(iVar26), iVar10 < iVar11;
              iVar10 = iVar10 + 1) {
            Imf_3_2::TiledOutputPart::writeTile(iVar26,iVar10,iVar7);
          }
          iVar7 = iVar7 + 1;
        }
        if (mode == RIPMAP_LEVELS) {
          this_01 = &local_b0;
          pIVar22 = &local_70;
          image0_00 = &local_120;
          for (iVar7 = 0; iVar10 = Imf_3_2::TiledOutputPart::numYLevels(), iVar7 < iVar10;
              iVar7 = iVar7 + 1) {
            iVar10 = Imf_3_2::TiledOutputPart::numYLevels();
            if (iVar7 < iVar10 + -1) {
              Imf_3_2::TiledOutputPart::dataWindowForLevel((int)(Box2i *)(local_230 + 0x18),iVar26);
              Image::resize(pIVar22,(Box2i *)(local_230 + 0x18));
              pCVar20 = (ChannelList *)Imf_3_2::Header::channels();
              anon_unknown.dwarf_1e45e::reduceY
                        (pCVar20,doNotFilter,extY,(bool)((byte)iVar7 & 1),image0_00,pIVar22);
            }
            local_230._16_8_ = pIVar22;
            for (iVar10 = 0; iVar11 = Imf_3_2::TiledOutputPart::numXLevels(), iVar10 < iVar11;
                iVar10 = iVar10 + 1) {
              if (iVar10 != 0 || iVar7 != 0) {
                if (verbose) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"level (",7);
                  poVar21 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar10);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar21,", ",2);
                  poVar21 = (ostream *)std::ostream::operator<<((ostream *)poVar21,iVar7);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar21,")",1);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar21 + -0x18) + (char)poVar21);
                  std::ostream::put((char)poVar21);
                  std::ostream::flush();
                }
                pCVar20 = (ChannelList *)Imf_3_2::Header::channels();
                anon_unknown.dwarf_1e45e::storeLevel
                          ((TiledOutputPart *)&local_250,pCVar20,iVar10,iVar7,image0_00);
              }
              iVar11 = Imf_3_2::TiledOutputPart::numXLevels();
              pIVar22 = image0_00;
              if (iVar10 < iVar11 + -1) {
                Imf_3_2::TiledOutputPart::dataWindowForLevel
                          ((int)(Box2i *)(local_230 + 0x18),iVar26);
                Image::resize(this_01,(Box2i *)(local_230 + 0x18));
                pCVar20 = (ChannelList *)Imf_3_2::Header::channels();
                anon_unknown.dwarf_1e45e::reduceX
                          (pCVar20,doNotFilter,extX,(bool)((byte)iVar10 & 1),image0_00,this_01);
                pIVar22 = this_01;
                this_01 = image0_00;
              }
              image0_00 = pIVar22;
            }
            pIVar22 = image0_00;
            image0_00 = (Image *)local_230._16_8_;
          }
        }
        else {
          lx = mode;
          if (mode == MIPMAP_LEVELS) {
            for (; iVar7 = Imf_3_2::TiledOutputPart::numLevels(), (int)lx < iVar7;
                lx = lx + MIPMAP_LEVELS) {
              Imf_3_2::TiledOutputPart::dataWindowForLevel((int)(Box2i *)(local_230 + 0x18),iVar26);
              Image::resize(&local_b0,(Box2i *)(local_230 + 0x18));
              pCVar20 = (ChannelList *)Imf_3_2::Header::channels();
              odd = (bool)((byte)lx & 1);
              anon_unknown.dwarf_1e45e::reduceX(pCVar20,doNotFilter,extX,odd,&local_120,&local_b0);
              Imf_3_2::TiledOutputPart::dataWindowForLevel((int)(Box2i *)(local_230 + 0x18),iVar26);
              Image::resize(&local_120,(Box2i *)(local_230 + 0x18));
              pCVar20 = (ChannelList *)Imf_3_2::Header::channels();
              anon_unknown.dwarf_1e45e::reduceY(pCVar20,doNotFilter,extY,odd,&local_b0,&local_120);
              if (verbose) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"level (",7);
                poVar21 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,lx);
                std::__ostream_insert<char,std::char_traits<char>>(poVar21,", ",2);
                poVar21 = (ostream *)std::ostream::operator<<((ostream *)poVar21,lx);
                std::__ostream_insert<char,std::char_traits<char>>(poVar21,")",1);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar21 + -0x18) + (char)poVar21);
                std::ostream::put((char)poVar21);
                std::ostream::flush();
              }
              pCVar20 = (ChannelList *)Imf_3_2::Header::channels();
              anon_unknown.dwarf_1e45e::storeLevel
                        ((TiledOutputPart *)&local_250,pCVar20,lx,lx,&local_120);
            }
          }
        }
      }
      else {
        Imf_3_2::Header::Header
                  ((Header *)(local_230 + 0x18),
                   local_178.super__Vector_base<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>.
                   _M_impl.super__Vector_impl_data._M_start + (long)pcVar23 * 0x38);
        plVar19 = (long *)Imf_3_2::Header::type_abi_cxx11_();
        local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_250,*plVar19,plVar19[1] + *plVar19);
        __n = local_250._M_string_length;
        iVar7 = (int)pcVar23;
        if ((local_250._M_string_length == DAT_0010f448) &&
           ((local_250._M_string_length == 0 ||
            (iVar10 = bcmp(local_250._M_dataplus._M_p,Imf_3_2::TILEDIMAGE_abi_cxx11_,
                           local_250._M_string_length), iVar10 == 0)))) {
          Imf_3_2::TiledInputPart::TiledInputPart((TiledInputPart *)&local_1e0,local_1c0,iVar7);
          Imf_3_2::TiledOutputPart::TiledOutputPart
                    ((TiledOutputPart *)local_230,(MultiPartOutputFile *)&local_1a0,iVar7);
          Imf_3_2::TiledOutputPart::copyPixels((TiledInputPart *)local_230);
        }
        else if ((__n == DAT_0010f428) &&
                ((__n == 0 ||
                 (iVar10 = bcmp(local_250._M_dataplus._M_p,Imf_3_2::SCANLINEIMAGE_abi_cxx11_,__n),
                 iVar10 == 0)))) {
          Imf_3_2::InputPart::InputPart((InputPart *)&local_1e0,local_1c0,iVar7);
          Imf_3_2::OutputPart::OutputPart
                    ((OutputPart *)local_230,(MultiPartOutputFile *)&local_1a0,iVar7);
          Imf_3_2::OutputPart::copyPixels((InputPart *)local_230);
        }
        else if ((__n == DAT_0010f468) &&
                ((__n == 0 ||
                 (iVar10 = bcmp(local_250._M_dataplus._M_p,Imf_3_2::DEEPSCANLINE_abi_cxx11_,__n),
                 iVar10 == 0)))) {
          Imf_3_2::DeepScanLineInputPart::DeepScanLineInputPart
                    ((DeepScanLineInputPart *)&local_1e0,local_1c0,iVar7);
          Imf_3_2::DeepScanLineOutputPart::DeepScanLineOutputPart
                    ((DeepScanLineOutputPart *)local_230,(MultiPartOutputFile *)&local_1a0,iVar7);
          Imf_3_2::DeepScanLineOutputPart::copyPixels((DeepScanLineInputPart *)local_230);
        }
        else if ((__n == DAT_0010f488) &&
                ((__n == 0 ||
                 (iVar10 = bcmp(local_250._M_dataplus._M_p,Imf_3_2::DEEPTILE_abi_cxx11_,__n),
                 iVar10 == 0)))) {
          Imf_3_2::DeepTiledInputPart::DeepTiledInputPart
                    ((DeepTiledInputPart *)&local_1e0,local_1c0,iVar7);
          Imf_3_2::DeepTiledOutputPart::DeepTiledOutputPart
                    ((DeepTiledOutputPart *)local_230,(MultiPartOutputFile *)&local_1a0,iVar7);
          Imf_3_2::DeepTiledOutputPart::copyPixels((DeepTiledInputPart *)local_230);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
        }
        Imf_3_2::Header::~Header((Header *)(local_230 + 0x18));
      }
      pcVar23 = pcVar23 + 1;
    } while (pcVar23 != local_1b0);
  }
  if (verbose) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"done.",5);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
  }
  Imf_3_2::MultiPartOutputFile::~MultiPartOutputFile((MultiPartOutputFile *)&local_1a0);
  Imf_3_2::MultiPartInputFile::~MultiPartInputFile(local_1c0);
  std::vector<Imf_3_2::Header,_std::allocator<Imf_3_2::Header>_>::~vector(&local_178);
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
  ::~_Rb_tree(&local_e0);
  Imf_3_2::Header::~Header((Header *)local_158);
  Image::~Image(&local_70);
  Image::~Image(&local_b0);
  Image::~Image(&local_120);
  return;
}

Assistant:

void
makeTiled (
    const char         inFileName[],
    const char         outFileName[],
    int                partnum,
    LevelMode          mode,
    LevelRoundingMode  roundingMode,
    Compression        compression,
    int                tileSizeX,
    int                tileSizeY,
    const set<string>& doNotFilter,
    Extrapolation      extX,
    Extrapolation      extY,
    bool               verbose)
{
    Image          image0;
    Image          image1;
    Image          image2;
    Header         header;
    FrameBuffer    fb;
    vector<Header> headers;

    //
    // Load the input image
    //

    MultiPartInputFile input (inFileName);
    int                parts = input.parts ();

    for (int p = 0; p < parts; p++)
    {
        if (verbose) cout << "reading file " << inFileName << endl;

        if (p == partnum)
        {
            InputPart in (input, p);
            header = in.header ();
            if (hasEnvmap (header) && mode != ONE_LEVEL)
            {
                //
                // Proper low-pass filtering and subsampling
                // of environment maps is not implemented in
                // this program.
                //

                throw IEX_NAMESPACE::NoImplExc (
                    "This program cannot generate "
                    "multiresolution environment maps.  "
                    "Use exrenvmap instead.");
            }

            image0.resize (header.dataWindow ());

            for (ChannelList::ConstIterator i = header.channels ().begin ();
                 i != header.channels ().end ();
                 ++i)
            {
                const char*    name    = i.name ();
                const Channel& channel = i.channel ();

                if (channel.xSampling != 1 || channel.ySampling != 1)
                {
                    throw IEX_NAMESPACE::InputExc (
                        "Sub-sampled image channels are "
                        "not supported in tiled files.");
                }

                image0.addChannel (name, channel.type);
                image1.addChannel (name, channel.type);
                image2.addChannel (name, channel.type);
                fb.insert (name, image0.channel (name).slice ());
            }

            in.setFrameBuffer (fb);
            in.readPixels (
                header.dataWindow ().min.y, header.dataWindow ().max.y);

            //
            // Generate the header for the output file by modifying
            // the input file's header
            //

            header.setTileDescription (
                TileDescription (tileSizeX, tileSizeY, mode, roundingMode));

            header.compression () = compression;
            header.lineOrder ()   = INCREASING_Y;

            if (mode != ONE_LEVEL)
                addWrapmodes (
                    header, extToString (extX) + "," + extToString (extY));

            //
            // set tileDescription, type, and chunckcount for multipart
            //
            header.setType (TILEDIMAGE);
            int chunkcount = getChunkOffsetTableSize (header);
            header.setChunkCount (chunkcount);

            headers.push_back (header);
        }
        else
        {
            Header h = input.header (p);
            headers.push_back (h);
        }
    }

    //
    // Store the highest-resolution level of the image in the output file
    //

    MultiPartOutputFile output (outFileName, &headers[0], headers.size ());

    for (int p = 0; p < parts; p++)
    {
        if (p == partnum)
        {
            try
            {
                TiledOutputPart out (output, partnum);
                //    TiledOutputFile out (outFileName, header);

                out.setFrameBuffer (fb);

                if (verbose)
                    cout << "writing file " << outFileName
                         << "\n"
                            "level (0, 0)"
                         << endl;

                for (int y = 0; y < out.numYTiles (0); ++y)
                    for (int x = 0; x < out.numXTiles (0); ++x)
                        out.writeTile (x, y, 0);

                //
                // If necessary, generate the lower-resolution mipmap
                // or ripmap levels, and store them in the output file.
                //

                if (mode == MIPMAP_LEVELS)
                {
                    for (int l = 1; l < out.numLevels (); ++l)
                    {
                        image1.resize (out.dataWindowForLevel (l, l - 1));

                        reduceX (
                            header.channels (),
                            doNotFilter,
                            extX,
                            l & 1,
                            image0,
                            image1);

                        image0.resize (out.dataWindowForLevel (l, l));

                        reduceY (
                            header.channels (),
                            doNotFilter,
                            extY,
                            l & 1,
                            image1,
                            image0);

                        if (verbose)
                            cout << "level (" << l << ", " << l << ")" << endl;

                        storeLevel (out, header.channels (), l, l, image0);
                    }
                }

                if (mode == RIPMAP_LEVELS)
                {
                    Image* iptr0 = &image0;
                    Image* iptr1 = &image1;
                    Image* iptr2 = &image2;

                    for (int ly = 0; ly < out.numYLevels (); ++ly)
                    {
                        if (ly < out.numYLevels () - 1)
                        {
                            iptr2->resize (out.dataWindowForLevel (0, ly + 1));

                            reduceY (
                                header.channels (),
                                doNotFilter,
                                extY,
                                ly & 1,
                                *iptr0,
                                *iptr2);
                        }

                        for (int lx = 0; lx < out.numXLevels (); ++lx)
                        {
                            if (lx != 0 || ly != 0)
                            {
                                if (verbose)
                                    cout << "level (" << lx << ", " << ly << ")"
                                         << endl;

                                storeLevel (
                                    out, header.channels (), lx, ly, *iptr0);
                            }

                            if (lx < out.numXLevels () - 1)
                            {
                                iptr1->resize (
                                    out.dataWindowForLevel (lx + 1, ly));

                                reduceX (
                                    header.channels (),
                                    doNotFilter,
                                    extX,
                                    lx & 1,
                                    *iptr0,
                                    *iptr1);

                                swap (iptr0, iptr1);
                            }
                        }

                        swap (iptr2, iptr0);
                    }
                }
            }
            catch (const exception& e)
            {
                cerr << e.what () << endl;
            }
        }
        else
        {
            Header      header = headers[p];
            std::string type   = header.type ();
            if (type == TILEDIMAGE)
            {
                TiledInputPart  in (input, p);
                TiledOutputPart out (output, p);
                out.copyPixels (in);
            }
            else if (type == SCANLINEIMAGE)
            {
                using std::max;
                InputPart  in (input, p);
                OutputPart out (output, p);
                out.copyPixels (in);
            }
            else if (type == DEEPSCANLINE)
            {
                DeepScanLineInputPart  in (input, p);
                DeepScanLineOutputPart out (output, p);
                out.copyPixels (in);
            }
            else if (type == DEEPTILE)
            {
                DeepTiledInputPart  in (input, p);
                DeepTiledOutputPart out (output, p);
                out.copyPixels (in);
            }
        }
    }

    if (verbose) cout << "done." << endl;
}